

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O3

int ReadFileToCStringsList(CStringsList **f,char *end)

{
  int iVar1;
  CStringsList *this;
  bool SplitByColon;
  char *p;
  char *local_38;
  
  iVar1 = ReadLineNoMacro(true);
  if (iVar1 != 0) {
    SplitByColon = true;
    do {
      CompiledCurrentLine = CompiledCurrentLine + 1;
      local_38 = line;
      SkipBlanks(&local_38);
      if (*local_38 == '.') {
        local_38 = local_38 + 1;
      }
      iVar1 = cmphstr(&local_38,end,false);
      if (iVar1 != 0) {
        lp = ReplaceDefine(local_38);
        return 1;
      }
      this = (CStringsList *)operator_new(0x28);
      CStringsList::CStringsList(this,line,(CStringsList *)0x0);
      *f = this;
      ListFile(true);
      if (SplitByColon) {
        iVar1 = cmphstr(&local_38,"lua",false);
        SplitByColon = iVar1 == 0;
      }
      else {
        iVar1 = cmphstr(&local_38,"endlua",false);
        SplitByColon = iVar1 != 0;
      }
      f = &this->next;
      iVar1 = ReadLineNoMacro(SplitByColon);
    } while (iVar1 != 0);
  }
  return 0;
}

Assistant:

int ReadFileToCStringsList(CStringsList*& f, const char* end) {
	// f itself should be already NULL, not resetting it here
	CStringsList** s = &f;
	bool SplitByColon = true;
	while (ReadLineNoMacro(SplitByColon)) {
		++CompiledCurrentLine;
		char* p = line;
		SkipBlanks(p);
		if ('.' == *p) ++p;
		if (cmphstr(p, end)) {		// finished, read rest after end marker into line buffers
			lp = ReplaceDefine(p);
			return 1;
		}
		*s = new CStringsList(line);
		s = &((*s)->next);
		ListFile(true);
		// Try to ignore colons inside lua blocks... this is far from bulletproof, but should improve it
		if (SplitByColon && cmphstr(p, "lua")) {
			SplitByColon = false;
		} else if (!SplitByColon && cmphstr(p, "endlua")) {
			SplitByColon = true;
		}
	}
	return 0;
}